

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IterSetOutputs_Col100(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  byte bVar1;
  int iVar2;
  Fts5Colset *pFVar3;
  u8 *puVar4;
  byte *pbVar5;
  byte *pbVar6;
  u8 *puVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  
  if (pSeg->pLeaf->szLeaf < pSeg->nPos + pSeg->iLeafOffset) {
    (pIter->poslist).n = 0;
    fts5SegiterPoslist(pIter->pIndex,pSeg,pIter->pColset,&pIter->poslist);
    (pIter->base).iRowid = pSeg->iRowid;
    (pIter->base).pData = (pIter->poslist).p;
    (pIter->base).nData = (pIter->poslist).n;
    return;
  }
  pbVar5 = pSeg->pLeaf->p + pSeg->iLeafOffset;
  pbVar6 = pbVar5 + pSeg->nPos;
  puVar7 = (pIter->poslist).p;
  pFVar3 = pIter->pColset;
  piVar9 = pFVar3->aiCol;
  iVar2 = pFVar3->nCol;
  (pIter->base).iRowid = pSeg->iRowid;
  iVar10 = 0;
  iVar8 = iVar10;
  while (pbVar5 < pbVar6) {
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    iVar10 = iVar10 + (uint)bVar1 + -2;
    while (*piVar9 < iVar10) {
      piVar9 = piVar9 + 1;
      if (piVar9 == pFVar3->aiCol + iVar2) goto LAB_0019193d;
    }
    if (*piVar9 == iVar10) {
      *puVar7 = ((char)iVar10 - (char)iVar8) + '\x02';
      puVar7 = puVar7 + 1;
      iVar8 = iVar10;
    }
  }
LAB_0019193d:
  puVar4 = (pIter->poslist).p;
  (pIter->base).pData = puVar4;
  (pIter->base).nData = (int)puVar7 - (int)puVar4;
  return;
}

Assistant:

static void fts5IterSetOutputs_Col100(Fts5Iter *pIter, Fts5SegIter *pSeg){

  assert( pIter->pIndex->pConfig->eDetail==FTS5_DETAIL_COLUMNS );
  assert( pIter->pColset );

  if( pSeg->iLeafOffset+pSeg->nPos>pSeg->pLeaf->szLeaf ){
    fts5IterSetOutputs_Col(pIter, pSeg);
  }else{
    u8 *a = (u8*)&pSeg->pLeaf->p[pSeg->iLeafOffset];
    u8 *pEnd = (u8*)&a[pSeg->nPos]; 
    int iPrev = 0;
    int *aiCol = pIter->pColset->aiCol;
    int *aiColEnd = &aiCol[pIter->pColset->nCol];

    u8 *aOut = pIter->poslist.p;
    int iPrevOut = 0;

    pIter->base.iRowid = pSeg->iRowid;

    while( a<pEnd ){
      iPrev += (int)a++[0] - 2;
      while( *aiCol<iPrev ){
        aiCol++;
        if( aiCol==aiColEnd ) goto setoutputs_col_out;
      }
      if( *aiCol==iPrev ){
        *aOut++ = (u8)((iPrev - iPrevOut) + 2);
        iPrevOut = iPrev;
      }
    }

setoutputs_col_out:
    pIter->base.pData = pIter->poslist.p;
    pIter->base.nData = aOut - pIter->poslist.p;
  }
}